

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O2

TIFFReadDirEntryErr
TIFFReadDirEntryArrayWithLimit
          (TIFF *tif,TIFFDirEntry *direntry,uint32_t *count,uint32_t desttypesize,void **value,
          uint64_t maxcount)

{
  void *dest;
  TIFF *tif_00;
  uint uVar1;
  uint uVar2;
  TIFFReadDirEntryErr TVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  void *data;
  uint32_t offset;
  undefined4 uStack_44;
  void **local_40;
  TIFF *local_38;
  ulong uVar7;
  
  local_38 = tif;
  uVar1 = TIFFDataWidth((uint)direntry->tdir_type);
  tif_00 = local_38;
  uVar7 = direntry->tdir_count;
  if (uVar7 < maxcount) {
    maxcount = uVar7;
  }
  if (uVar1 == 0 || maxcount == 0) {
    *value = (void *)0x0;
    return TIFFReadDirEntryErrOk;
  }
  uVar5 = 10;
  if (uVar7 < 10) {
    uVar5 = uVar7;
  }
  if (0x7fffffff / (ulong)uVar1 < maxcount) {
    return TIFFReadDirEntryErrSizesan;
  }
  if (0x7fffffff / (ulong)desttypesize < maxcount) {
    return TIFFReadDirEntryErrSizesan;
  }
  *count = (uint32_t)maxcount;
  uVar6 = uVar1 * (uint32_t)maxcount;
  uVar7 = (ulong)uVar6;
  local_40 = value;
  if (uVar6 == 0) {
    __assert_fail("(tmsize_t)datasize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x51d,
                  "enum TIFFReadDirEntryErr TIFFReadDirEntryArrayWithLimit(TIFF *, TIFFDirEntry *, uint32_t *, uint32_t, void **, uint64_t)"
                 );
  }
  uVar2 = local_38->tif_flags;
  if ((uVar2 >> 0xb & 1) == 0) {
    if (((8 < uVar6 & (byte)(uVar2 >> 0x13) & 1) == 0) && (uVar6 < 5 || (uVar2 >> 0x13 & 1) != 0))
    goto LAB_00252bf1;
    data = (void *)0x0;
  }
  else {
    if ((ulong)local_38->tif_size < uVar7) {
      return TIFFReadDirEntryErrIo;
    }
LAB_00252bf1:
    data = _TIFFCheckMalloc(local_38,maxcount,(long)(int)uVar1,"ReadDirEntryArray");
    if (data == (void *)0x0) {
      return TIFFReadDirEntryErrAlloc;
    }
    uVar2 = tif_00->tif_flags;
  }
  dest = data;
  iVar4 = uVar1 * (int)uVar5;
  if ((uVar2 >> 0x13 & 1) == 0) {
    if ((4 < iVar4) || (4 < uVar6)) {
      _offset = CONCAT44(uStack_44,(direntry->tdir_offset).toff_long);
      if ((char)uVar2 < '\0') {
        TIFFSwabLong(&offset);
        uVar2 = tif_00->tif_flags;
      }
      uVar5 = _offset & 0xffffffff;
      if ((uVar2 >> 0xb & 1) != 0) goto LAB_00252caf;
LAB_00252c58:
      TVar3 = TIFFReadDirEntryDataAndRealloc(tif_00,uVar5,uVar7,&data);
LAB_00252cbd:
      if (TVar3 != TIFFReadDirEntryErrOk) {
        _TIFFfreeExt(tif_00,data);
        return TVar3;
      }
      goto LAB_00252cd3;
    }
  }
  else if ((8 < iVar4) || (8 < uVar6)) {
    _offset = (direntry->tdir_offset).toff_long8;
    if ((char)uVar2 < '\0') {
      TIFFSwabLong8((uint64_t *)&offset);
      uVar2 = tif_00->tif_flags;
    }
    uVar5 = _offset;
    if ((uVar2 >> 0xb & 1) == 0) goto LAB_00252c58;
LAB_00252caf:
    TVar3 = TIFFReadDirEntryData(tif_00,uVar5,uVar7,dest);
    goto LAB_00252cbd;
  }
  _TIFFmemcpy(data,&direntry->tdir_offset,uVar7);
LAB_00252cd3:
  *local_40 = data;
  return TIFFReadDirEntryErrOk;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryArrayWithLimit(TIFF *tif, TIFFDirEntry *direntry,
                               uint32_t *count, uint32_t desttypesize,
                               void **value, uint64_t maxcount)
{
    int typesize;
    uint32_t datasize;
    void *data;
    uint64_t target_count64;
    int original_datasize_clamped;
    typesize = TIFFDataWidth(direntry->tdir_type);

    target_count64 =
        (direntry->tdir_count > maxcount) ? maxcount : direntry->tdir_count;

    if ((target_count64 == 0) || (typesize == 0))
    {
        *value = 0;
        return (TIFFReadDirEntryErrOk);
    }
    (void)desttypesize;

    /* We just want to know if the original tag size is more than 4 bytes
     * (classic TIFF) or 8 bytes (BigTIFF)
     */
    original_datasize_clamped =
        ((direntry->tdir_count > 10) ? 10 : (int)direntry->tdir_count) *
        typesize;

    /*
     * As a sanity check, make sure we have no more than a 2GB tag array
     * in either the current data type or the dest data type.  This also
     * avoids problems with overflow of tmsize_t on 32bit systems.
     */
    if ((uint64_t)(MAX_SIZE_TAG_DATA / typesize) < target_count64)
        return (TIFFReadDirEntryErrSizesan);
    if ((uint64_t)(MAX_SIZE_TAG_DATA / desttypesize) < target_count64)
        return (TIFFReadDirEntryErrSizesan);

    *count = (uint32_t)target_count64;
    datasize = (*count) * typesize;
    assert((tmsize_t)datasize > 0);

    if (isMapped(tif) && datasize > (uint64_t)tif->tif_size)
        return TIFFReadDirEntryErrIo;

    if (!isMapped(tif) && (((tif->tif_flags & TIFF_BIGTIFF) && datasize > 8) ||
                           (!(tif->tif_flags & TIFF_BIGTIFF) && datasize > 4)))
    {
        data = NULL;
    }
    else
    {
        data = _TIFFCheckMalloc(tif, *count, typesize, "ReadDirEntryArray");
        if (data == 0)
            return (TIFFReadDirEntryErrAlloc);
    }
    if (!(tif->tif_flags & TIFF_BIGTIFF))
    {
        /* Only the condition on original_datasize_clamped. The second
         * one is implied, but Coverity Scan cannot see it. */
        if (original_datasize_clamped <= 4 && datasize <= 4)
            _TIFFmemcpy(data, &direntry->tdir_offset, datasize);
        else
        {
            enum TIFFReadDirEntryErr err;
            uint32_t offset = direntry->tdir_offset.toff_long;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong(&offset);
            if (isMapped(tif))
                err = TIFFReadDirEntryData(tif, (uint64_t)offset,
                                           (tmsize_t)datasize, data);
            else
                err = TIFFReadDirEntryDataAndRealloc(tif, (uint64_t)offset,
                                                     (tmsize_t)datasize, &data);
            if (err != TIFFReadDirEntryErrOk)
            {
                _TIFFfreeExt(tif, data);
                return (err);
            }
        }
    }
    else
    {
        /* See above comment for the Classic TIFF case */
        if (original_datasize_clamped <= 8 && datasize <= 8)
            _TIFFmemcpy(data, &direntry->tdir_offset, datasize);
        else
        {
            enum TIFFReadDirEntryErr err;
            uint64_t offset = direntry->tdir_offset.toff_long8;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&offset);
            if (isMapped(tif))
                err = TIFFReadDirEntryData(tif, (uint64_t)offset,
                                           (tmsize_t)datasize, data);
            else
                err = TIFFReadDirEntryDataAndRealloc(tif, (uint64_t)offset,
                                                     (tmsize_t)datasize, &data);
            if (err != TIFFReadDirEntryErrOk)
            {
                _TIFFfreeExt(tif, data);
                return (err);
            }
        }
    }
    *value = data;
    return (TIFFReadDirEntryErrOk);
}